

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *fp;
  scanner tokens;
  scanner local_e8;
  analysis an;
  
  if (argc < 2) {
    puts("[HINT] Usage: vcc {<option> <args>} <filename>.c");
  }
  else {
    fp = fopen(argv[1],"r");
    if (fp != (FILE *)0x0) {
      dh::scanner::scanner(&tokens);
      dh::scanner::scan(&tokens,(FILE *)fp);
      bVar1 = dh::scanner::isRight(&tokens);
      if (bVar1) {
        dh::scanner::scanner(&local_e8,&tokens);
        dh::analysis::analysis(&an,&local_e8);
        dh::scanner::~scanner(&local_e8);
        dh::analysis::initSynTree(&an);
        dh::analysis::printTree(&an);
        dh::analysis::genMidCode(&an);
        dh::analysis::printMidCode(&an);
        dh::analysis::genCode(&an);
        dh::analysis::~analysis(&an);
      }
      dh::scanner::~scanner(&tokens);
      return (uint)!bVar1;
    }
    perror(argv[1]);
  }
  exit(1);
}

Assistant:

int main( int argc, char** argv)
{
	if( argc <= 1)
	{
		::std::printf("[HINT] Usage: vcc {<option> <args>} <filename>.c\n");
		::std::exit(1);
	}

	FILE* fp = ::std::fopen(argv[1],"r");
	if ( NULL == fp)
	{
		::std::perror(argv[1]);
		::std::exit(1);
	}

	::dh::scanner tokens;
	
	tokens.scan(fp);

	if ( !tokens.isRight())
	{
		return 1;
	}

#ifdef _DEBUG_
	tokens.debug();
#endif

	::dh::analysis an(tokens);
	an.initSynTree();
	an.printTree();
	an.genMidCode();
	an.printMidCode();
	an.genCode();

	////// test hash table
	/*
	dh::symNodePtr tmp_node(new dh::symTabElem);
	tmp_node->name = "f";
	::std::shared_ptr< dh::symTab > tab(new dh::symTab("f",1));
	tab->insert_elem(tmp_node);

	::std::cout << "[A0] " << tab->get_in_function() << ::std::endl;
	::std::cout << "[A] " << (tab->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;

	::std::shared_ptr< dh::symTab > tab2(new dh::symTab("f",1));

	tab2->set_upper_tab(tab);

	::std::cout << "[A] " << (tab2->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;
	::std::cout << "[B] " << (tab2->research_elem_global(tab->get_in_function()) == nullptr) << ::std::endl;
	*/
	return 0;
	
}